

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCreateSourceAndEventIf.cpp
# Opt level: O3

int anon_unknown.dwarf_278f22::failIfCalled(void)

{
  code *pcVar1;
  char extraout_AL;
  int iVar2;
  int extraout_EAX;
  double __x;
  MessageBuilder _DOCTEST_MESSAGE_2;
  MessageBuilder MStack_38;
  
  doctest::detail::MessageBuilder::MessageBuilder
            (&MStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestCreateSourceAndEventIf.cpp"
             ,0x1c,is_require);
  std::__ostream_insert<char,std::char_traits<char>>
            (MStack_38.m_stream,"Argument of disabled severity evaluated",0x27);
  doctest::detail::MessageBuilder::log(&MStack_38,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    iVar2 = (*pcVar1)();
    return iVar2;
  }
  doctest::detail::MessageBuilder::react(&MStack_38);
  doctest::detail::MessageBuilder::~MessageBuilder(&MStack_38);
  return extraout_EAX;
}

Assistant:

int failIfCalled()
{
  FAIL("Argument of disabled severity evaluated");
  return 0;
}